

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,status_type *S)

{
  undefined4 uVar1;
  uint uVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  uint i;
  ulong uVar5;
  status_type S_new;
  delim_c local_1035;
  undefined1 local_1034 [4100];
  
  uVar5 = 0;
  memset(local_1034,0,0x1004);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_1035.c = '(';
  pbVar3 = utility::operator>>(in,&local_1035);
  std::istream::_M_extract<unsigned_int>((uint *)pbVar3);
  while( true ) {
    uVar2 = lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::status_type::size();
    if (uVar2 <= uVar5) break;
    local_1035.c = ' ';
    pbVar3 = utility::operator>>(in,&local_1035);
    std::istream::_M_extract<unsigned_int>((uint *)pbVar3);
    uVar5 = uVar5 + 1;
  }
  local_1035.c = ')';
  utility::operator>>(in,&local_1035);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    memcpy(S,local_1034,0x1004);
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          in >> utility::delim(' ') >> S_new.r[i];
        in >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }